

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O3

void getSWTRecCoeff(double *coeff,int *length,char *ctype,int level,int J,double *lpr,double *hpr,
                   int lf,int siglength,double *swtop)

{
  double *__s;
  int a;
  int iVar1;
  void *__s_00;
  void *__s_01;
  void *__ptr;
  void *__ptr_00;
  double *x;
  double *x_00;
  double *y;
  double *oup;
  double *oup_00;
  double *oup_01;
  double *oup_02;
  void *__ptr_01;
  double *array;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  uint uVar7;
  int iVar8;
  int N;
  size_t sVar9;
  uint uVar10;
  void *__dest;
  undefined4 in_register_00000084;
  ulong uVar11;
  size_t __size;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  undefined4 in_stack_0000001c;
  double *local_100;
  uint local_34;
  
  __s = (double *)CONCAT44(in_stack_0000001c,siglength);
  __size = (long)lf << 3;
  __s_00 = malloc(__size);
  __s_01 = malloc(__size);
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  x = (double *)malloc(__size);
  x_00 = (double *)malloc(__size);
  y = (double *)malloc(__size);
  sVar9 = (long)(int)((lf * 2 - (lf - (lf >> 0x1f) & 0xfffffffeU)) + (int)hpr) << 3;
  oup = (double *)malloc(sVar9);
  oup_00 = (double *)malloc(sVar9);
  sVar9 = (long)(lf + (int)hpr * 2) << 3;
  oup_01 = (double *)malloc(sVar9);
  oup_02 = (double *)malloc(sVar9);
  __ptr_01 = malloc(__size);
  array = (double *)malloc(__size);
  if (0 < (int)ctype) {
    uVar10 = level - (int)ctype;
    a = (int)(((ulong)hpr & 0xffffffff) >> 0x1f) + (int)hpr >> 1;
    sVar9 = (ulong)(uint)lf << 3;
    lVar2 = (long)((int)hpr + -1);
    local_34 = uVar10;
    do {
      if (0 < lf) {
        memset(__s,0,sVar9);
      }
      iVar1 = strcmp((char *)length,"appx");
      uVar7 = local_34 ^ uVar10;
      if (iVar1 == 0 && uVar7 == 0) {
        if (0 < lf) {
          memset(__s_01,0,sVar9);
          __dest = __s_00;
LAB_001074e4:
          memcpy(__dest,coeff,sVar9);
        }
      }
      else {
        iVar1 = strcmp((char *)length,"det");
        if (iVar1 == 0 && uVar7 == 0) {
          if (0 < lf) {
            memset(__s_00,0,sVar9);
            __dest = __s_01;
            goto LAB_001074e4;
          }
        }
        else if (0 < lf) {
          memset(__s_01,0,sVar9);
        }
      }
      dVar15 = ldexp(1.0,~local_34 + level);
      uVar7 = (uint)dVar15;
      if (0 < (int)uVar7) {
        uVar11 = (ulong)uVar7;
        uVar3 = 0;
        local_100 = __s;
        do {
          uVar14 = 0;
          iVar1 = 0;
          if ((int)uVar3 < lf) {
            uVar4 = uVar3;
            uVar14 = 0;
            do {
              uVar13 = uVar14;
              *(undefined8 *)((long)__ptr + uVar13 * 8) = *(undefined8 *)((long)__s_00 + uVar4 * 8);
              *(undefined8 *)((long)__ptr_00 + uVar13 * 8) =
                   *(undefined8 *)((long)__s_01 + uVar4 * 8);
              uVar14 = uVar13 + 1;
              uVar4 = uVar4 + uVar11;
            } while ((int)uVar4 < lf);
            iVar1 = ((uint)uVar13 >> 1) + 1;
            lVar5 = 0;
            do {
              *(undefined8 *)((long)x + lVar5) = *(undefined8 *)((long)__ptr + lVar5 * 2);
              *(undefined8 *)((long)x_00 + lVar5) = *(undefined8 *)((long)__ptr_00 + lVar5 * 2);
              lVar5 = lVar5 + 8;
            } while ((uVar13 >> 1 & 0x7fffffff) * 8 + 8 != lVar5);
          }
          upsamp2(x,iVar1,2,y);
          per_ext(y,iVar1 * 2,a,oup);
          upsamp2(x_00,iVar1,2,y);
          per_ext(y,iVar1 * 2,a,oup_00);
          iVar8 = (int)hpr + iVar1 * 2;
          conv_direct(oup,iVar8,(double *)CONCAT44(in_register_00000084,J),(int)hpr,oup_01);
          conv_direct(oup_00,iVar8,lpr,(int)hpr,oup_02);
          if (iVar1 != 0) {
            iVar1 = iVar8 + -1;
            if (iVar8 + -1 < (int)hpr) {
              iVar1 = (int)hpr;
            }
            lVar5 = 0;
            do {
              *(double *)((long)__ptr_01 + lVar5 * 8 + lVar2 * 8 + (long)(int)hpr * -8 + 8) =
                   oup_01[lVar2 + lVar5] + oup_02[lVar2 + lVar5];
              lVar5 = lVar5 + 1;
            } while (iVar1 + (1 - (int)hpr) != (int)lVar5);
          }
          iVar1 = 0;
          if (1 < (uint)uVar14) {
            uVar12 = (uint)uVar14 - 2 >> 1;
            iVar1 = uVar12 + 1;
            lVar5 = 0;
            do {
              *(undefined8 *)((long)x + lVar5) = *(undefined8 *)((long)__ptr + lVar5 * 2 + 8);
              *(undefined8 *)((long)x_00 + lVar5) = *(undefined8 *)((long)__ptr_00 + lVar5 * 2 + 8);
              lVar5 = lVar5 + 8;
            } while ((ulong)uVar12 * 8 + 8 != lVar5);
          }
          upsamp2(x,iVar1,2,y);
          iVar8 = iVar1 * 2;
          per_ext(y,iVar8,a,oup);
          upsamp2(x_00,iVar1,2,y);
          per_ext(y,iVar8,a,oup_00);
          N = (int)hpr + iVar1 * 2;
          conv_direct(oup,N,(double *)CONCAT44(in_register_00000084,J),(int)hpr,oup_01);
          conv_direct(oup_00,N,lpr,(int)hpr,oup_02);
          if (iVar1 != 0) {
            iVar1 = N + -1;
            if (N + -1 < (int)hpr) {
              iVar1 = (int)hpr;
            }
            lVar5 = 0;
            do {
              array[(lVar2 + lVar5 + 1) - (long)(int)hpr] =
                   oup_01[lVar2 + lVar5] + oup_02[lVar2 + lVar5];
              lVar5 = lVar5 + 1;
            } while (iVar1 + (1 - (int)hpr) != (int)lVar5);
          }
          circshift(array,iVar8,-1);
          if ((int)uVar3 < lf) {
            lVar5 = 0;
            uVar14 = uVar3;
            pdVar6 = local_100;
            do {
              *pdVar6 = (*(double *)((long)__ptr_01 + lVar5) + *(double *)((long)array + lVar5)) *
                        0.5;
              lVar5 = lVar5 + 8;
              pdVar6 = pdVar6 + uVar11;
              uVar12 = (int)uVar14 + uVar7;
              uVar14 = (ulong)uVar12;
            } while ((int)uVar12 < lf);
          }
          uVar3 = uVar3 + 1;
          local_100 = local_100 + 1;
        } while (uVar3 != uVar11);
      }
      if (0 < lf) {
        memcpy(__s_00,__s,sVar9);
      }
      local_34 = local_34 + 1;
    } while ((int)local_34 < level);
  }
  free(__s_00);
  free(__s_01);
  free(__ptr);
  free(__ptr_00);
  free(y);
  free(oup);
  free(oup_00);
  free(oup_01);
  free(oup_02);
  free(__ptr_01);
  free(array);
  free(x);
  free(x_00);
  return;
}

Assistant:

static void getSWTRecCoeff(double *coeff, int *length, const char *ctype, int level, int J, double *lpr,
	double *hpr, int lf, int siglength, double *swtop) {
	int N, iter, i, index, value, count, len;
	int index_shift, len0, U, N1, index2;
	double *appx1, *det1, *appx_sig, *det_sig, *cL0, *cH0, *tempx, *oup00L, *oup00H, *oup00, *oup01, *appx2, *det2;

	N = siglength;
	U = 2;

	appx_sig = (double*)malloc(sizeof(double)* N);
	det_sig = (double*)malloc(sizeof(double)* N);
	appx1 = (double*)malloc(sizeof(double)* N);
	det1 = (double*)malloc(sizeof(double)* N);
	appx2 = (double*)malloc(sizeof(double)* N);
	det2 = (double*)malloc(sizeof(double)* N);
	tempx = (double*)malloc(sizeof(double)* N);
	cL0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	cH0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	oup00L = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00H = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00 = (double*)malloc(sizeof(double)* N);
	oup01 = (double*)malloc(sizeof(double)* N);



	for (iter = J-level; iter < J; ++iter) {
		for (i = 0; i < N; ++i) {
			swtop[i] = 0.0;
		}
		if (!strcmp((ctype), "appx") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				appx_sig[i] = coeff[i];
				det_sig[i] = 0.0;
			}
		}
		else if (!strcmp((ctype), "det") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				det_sig[i] = coeff[i];
				appx_sig[i] = 0.0;
			}
		}
		else {
			for (i = 0; i < N; ++i) {
				det_sig[i] = 0.0;
			}
		}

		value = (int)pow(2.0, (double)(J - 1 - iter));

		for (count = 0; count < value; count++) {
			len = 0;
			for (index = count; index < N; index += value) {
				appx1[len] = appx_sig[index];
				det1[len] = det_sig[index];
				len++;
			}


			//SHIFT 0
			len0 = 0;

			for (index_shift = 0; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}
			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;


			
			conv_direct(cL0, N1, lpr, lf, oup00L);

			
			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup00[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			//SHIFT 1

			len0 = 0;

			for (index_shift = 1; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}

			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;

			conv_direct(cL0, N1, lpr, lf, oup00L);

			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup01[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			circshift(oup01, 2 * len0, -1);

			index2 = 0;

			for (index = count; index < N; index += value) {
				swtop[index] = (oup00[index2] + oup01[index2]) / 2.0;
				index2++;
			}

		}
		for (i = 0; i < N; ++i) {
			appx_sig[i] = swtop[i];
		}

	}



	free(appx_sig);
	free(det_sig);
	free(appx1);
	free(det1);
	free(tempx);
	free(cL0);
	free(cH0);
	free(oup00L);
	free(oup00H);
	free(oup00);
	free(oup01);
	free(appx2);
	free(det2);
}